

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O2

void __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::AddAlgebraicConstraint
          (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgConPrepare *pr)

{
  double dVar1;
  AlgConRange rr;
  AlgConRange rr_00;
  LinTerms *this_00;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> local_c20;
  LinTerms local_a38;
  LinTerms local_9c0;
  LinTerms local_948;
  LinTerms local_8d0;
  ExprType local_858;
  QuadTerms local_7d8;
  QuadTerms local_698;
  QuadAndLinTerms local_558;
  QuadAndLinTerms local_3a0;
  ExprType local_1e8;
  
  if ((pr->qt).folded_.
      super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.m_data.
      super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>.m_size
      == 0) {
    if (pr->compl_var < 0) {
      LinTerms::LinTerms(&local_8d0,&pr->lt);
      rr_00.lb_ = pr->lb;
      rr_00.ub_ = pr->ub;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)&local_c20,&local_8d0,rr_00,
                 true);
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRange>>
                ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  *)this,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)&local_c20);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *)&local_c20);
      this_00 = &local_8d0;
    }
    else {
      LinTerms::LinTerms(&local_948,&pr->lt);
      dVar1 = pr->const_term;
      LinTerms::LinTerms(&local_858.super_LinTerms,&local_948);
      local_858.constant_term_ = dVar1;
      ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::ComplementarityConstraint
                ((ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)&local_c20,
                 &local_858,pr->compl_var);
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                  *)this,(ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)
                         &local_c20);
      ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::~ComplementarityConstraint
                ((ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *)&local_c20);
      LinTerms::~LinTerms(&local_858.super_LinTerms);
      this_00 = &local_948;
    }
  }
  else if (pr->compl_var < 0) {
    LinTerms::LinTerms(&local_9c0,&pr->lt);
    QuadTerms::QuadTerms(&local_698,&pr->qt);
    QuadAndLinTerms::QuadAndLinTerms(&local_3a0,&local_9c0,&local_698);
    rr.lb_ = pr->lb;
    rr.ub_ = pr->ub;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)&local_c20,&local_3a0,rr
               ,true);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>
              ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,(AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)&local_c20);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)&local_c20);
    QuadAndLinTerms::~QuadAndLinTerms(&local_3a0);
    QuadTerms::~QuadTerms(&local_698);
    this_00 = &local_9c0;
  }
  else {
    LinTerms::LinTerms(&local_a38,&pr->lt);
    QuadTerms::QuadTerms(&local_7d8,&pr->qt);
    QuadAndLinTerms::QuadAndLinTerms(&local_558,&local_a38,&local_7d8);
    dVar1 = pr->const_term;
    QuadAndLinTerms::QuadAndLinTerms(&local_1e8.super_QuadAndLinTerms,&local_558);
    local_1e8.constant_term_ = dVar1;
    ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::
    ComplementarityConstraint(&local_c20,&local_1e8,pr->compl_var);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AddConstraint_AS_ROOT<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
              ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
                *)this,&local_c20);
    ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::
    ~ComplementarityConstraint(&local_c20);
    QuadAndLinTerms::~QuadAndLinTerms(&local_1e8.super_QuadAndLinTerms);
    QuadAndLinTerms::~QuadAndLinTerms(&local_558);
    QuadTerms::~QuadTerms(&local_7d8);
    this_00 = &local_a38;
  }
  LinTerms::~LinTerms(this_00);
  return;
}

Assistant:

void AddAlgebraicConstraint(AlgConPrepare&& pr) {
    if (pr.qt.empty()) {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( LinConRange{ std::move(pr.lt),
                            { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityLinear{
                AffineExpr(std::move(pr.lt), pr.const_term), pr.compl_var } );
    } else {
      if (pr.compl_var<0)
        AddConstraint_AS_ROOT( QuadConRange{
                              { std::move(pr.lt), std::move(pr.qt) },
                              { pr.lb, pr.ub }} );
      else
        AddConstraint_AS_ROOT(
              ComplementarityQuadratic{
                QuadraticExpr
                { { std::move(pr.lt), std::move(pr.qt) }, pr.const_term },
                pr.compl_var } );
    }
  }